

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O0

ulong lf_random_string_abi_cxx11_(void)

{
  result_type_conflict rVar1;
  ulong in_RDI;
  mt19937 generator;
  random_device rd;
  string str;
  result_type in_stack_ffffffffffffd878;
  undefined4 in_stack_ffffffffffffd880;
  random_device *in_stack_ffffffffffffd8c0;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffd930;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffd938;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffd940;
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_28,"0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  std::random_device::random_device(in_stack_ffffffffffffd8c0);
  rVar1 = std::random_device::operator()((random_device *)0x1164e2);
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine
            ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
              *)CONCAT44(rVar1,in_stack_ffffffffffffd880),in_stack_ffffffffffffd878);
  std::__cxx11::string::begin();
  std::__cxx11::string::end();
  std::
  shuffle<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>&>
            (in_stack_ffffffffffffd940,in_stack_ffffffffffffd938,in_stack_ffffffffffffd930);
  std::__cxx11::string::substr(in_RDI,(ulong)local_28);
  std::random_device::~random_device((random_device *)0x116560);
  std::__cxx11::string::~string(local_28);
  return in_RDI;
}

Assistant:

std::string lf_random_string()
{
    std::string str("0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz");

    std::random_device rd;
    std::mt19937 generator(rd());

    std::shuffle(str.begin(), str.end(), generator);

    return str.substr(0, 8);
}